

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Append(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  Gia_Man_t *pTwo;
  int iVar4;
  char *pcVar5;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"vh"), iVar2 == 0x76) {
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 == -1) {
    if (argc - globalUtilOptind == 1) {
      pcVar5 = argv[globalUtilOptind];
      pcVar3 = pcVar5;
      do {
        if (*pcVar3 == '>') {
          *pcVar3 = '\\';
        }
        else if (*pcVar3 == '\0') {
          __stream = fopen(pcVar5,"r");
          if (__stream == (FILE *)0x0) {
            Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar5);
            pcVar5 = Extra_FileGetSimilarName
                               (pcVar5,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
            if (pcVar5 != (char *)0x0) {
              Abc_Print(1,"Did you mean \"%s\"?",pcVar5);
            }
            pcVar5 = "\n";
            iVar2 = 1;
            iVar4 = iVar2;
          }
          else {
            fclose(__stream);
            pTwo = Gia_AigerRead(pcVar5,0,0,0);
            if (pTwo != (Gia_Man_t *)0x0) {
              Gia_ManDupAppend(pAbc->pGia,pTwo);
              Gia_ManStop(pTwo);
              return 0;
            }
            pcVar5 = "Reading AIGER has failed.\n";
            iVar2 = -1;
            iVar4 = 0;
          }
          Abc_Print(iVar2,pcVar5);
          return iVar4;
        }
        pcVar3 = pcVar3 + 1;
      } while( true );
    }
    pcVar5 = "File name is not given on the command line.\n";
    iVar2 = -1;
  }
  else {
    iVar2 = -2;
    Abc_Print(-2,"usage: &append [-vh] <file>\n");
    Abc_Print(-2,"\t         appends <file> to the current AIG using new PIs and POs\n");
    pcVar5 = "yes";
    if (!bVar1) {
      pcVar5 = "no";
    }
    Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    pcVar5 = "\t<file> : AIGER file with the design to miter\n";
  }
  Abc_Print(iVar2,pcVar5);
  return 1;
}

Assistant:

int Abc_CommandAbc9Append( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Gia_Man_t * pSecond;
    char * FileName, * pTemp;
    char ** pArgvNew;
    int nArgcNew;
    int c;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }

    // get the input file name
    FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    pSecond = Gia_AigerRead( FileName, 0, 0, 0 );
    if ( pSecond == NULL )
    {
        Abc_Print( -1, "Reading AIGER has failed.\n" );
        return 0;
    }
    // compute the miter
    Gia_ManDupAppend( pAbc->pGia, pSecond );
    Gia_ManStop( pSecond );
    return 0;

usage:
    Abc_Print( -2, "usage: &append [-vh] <file>\n" );
    Abc_Print( -2, "\t         appends <file> to the current AIG using new PIs and POs\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : AIGER file with the design to miter\n");
    return 1;
}